

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall cppcms::application::remove_context(application *this)

{
  application *paVar1;
  
  paVar1 = this->root_;
  if (paVar1 != paVar1->root_) {
    do {
      paVar1 = paVar1->root_;
      this->root_ = paVar1;
    } while (paVar1->root_ != paVar1);
  }
  ((paVar1->d).ptr_)->temp_conn = (context *)0x0;
  return;
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}